

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorPool::Tables::FindByNameHelper
          (Tables *this,DescriptorPool *pool,string *name)

{
  DescriptorPool *pool_00;
  Tables *this_00;
  bool bVar1;
  const_iterator cVar2;
  Type TVar4;
  Symbol SVar5;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  pointer local_30;
  anon_union_8_8_13f84498_for_Symbol_2 aVar3;
  
  local_38.mu_ = pool->mutex_;
  if (local_38.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_38.mu_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&this->known_bad_symbols_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&this->known_bad_files_);
  local_30 = (name->_M_dataplus)._M_p;
  cVar2 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->symbols_by_name_,&local_30);
  if (cVar2.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    TVar4 = NULL_SYMBOL;
    aVar3.descriptor = (Descriptor *)0x0;
  }
  else {
    TVar4 = *(Type *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                            ._M_cur + 0x10);
    aVar3 = (anon_union_8_8_13f84498_for_Symbol_2)
            ((anon_union_8_8_13f84498_for_Symbol_2 *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                   ._M_cur + 0x18))->descriptor;
  }
  if ((TVar4 == NULL_SYMBOL) && (pool_00 = pool->underlay_, pool_00 != (DescriptorPool *)0x0)) {
    this_00 = (pool_00->tables_).ptr_;
    if (this_00 == (Tables *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                   );
    }
    SVar5 = FindByNameHelper(this_00,pool_00,name);
    aVar3 = SVar5.field_1;
    TVar4 = SVar5.type;
  }
  if (TVar4 == NULL_SYMBOL) {
    bVar1 = TryFindSymbolInFallbackDatabase(pool,name);
    if (bVar1) {
      local_30 = (name->_M_dataplus)._M_p;
      cVar2 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&this->symbols_by_name_,&local_30);
      if (cVar2.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        aVar3.descriptor = (Descriptor *)0x0;
        TVar4 = NULL_SYMBOL;
      }
      else {
        TVar4 = *(Type *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                                ._M_cur + 0x10);
        aVar3 = (anon_union_8_8_13f84498_for_Symbol_2)
                ((anon_union_8_8_13f84498_for_Symbol_2 *)
                ((long)cVar2.
                       super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                       ._M_cur + 0x18))->descriptor;
      }
    }
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  SVar5._4_4_ = 0;
  SVar5.type = TVar4;
  SVar5.field_1.descriptor = aVar3.descriptor;
  return SVar5;
}

Assistant:

Symbol DescriptorPool::Tables::FindByNameHelper(
    const DescriptorPool* pool, const string& name) {
  MutexLockMaybe lock(pool->mutex_);
  known_bad_symbols_.clear();
  known_bad_files_.clear();
  Symbol result = FindSymbol(name);

  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result =
      pool->underlay_->tables_->FindByNameHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // Symbol still not found, so check fallback database.
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = FindSymbol(name);
    }
  }

  return result;
}